

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_boundary_insertion<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>
               (void)

{
  Index *pIVar1;
  pointer puVar2;
  pointer pvVar3;
  pointer p_4;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  int iVar6;
  pointer p;
  node_ptr plVar7;
  Column_support *pCVar8;
  undefined4 local_7e8;
  int local_7e4;
  undefined **local_7e0;
  ulong local_7d8;
  shared_count sStack_7d0;
  undefined1 **local_7c8;
  undefined1 *local_7c0;
  undefined **local_7b8;
  undefined8 local_7b0;
  undefined1 local_7a8;
  undefined8 *local_7a0;
  undefined ***local_798;
  undefined **local_790;
  char *local_788;
  undefined8 *local_780;
  char *local_778;
  undefined1 local_770 [8];
  undefined8 local_768;
  shared_count sStack_760;
  char *local_758;
  char *local_750;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  value_type boundary1;
  value_type boundary2;
  Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_> m;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>>
            ();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&boundary2,
             orderedBoundaries.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1);
  puVar2 = orderedBoundaries.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar3 = orderedBoundaries.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (puVar2 != (pointer)0x0) {
    pvVar3 = orderedBoundaries.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    orderedBoundaries.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         orderedBoundaries.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(puVar2,(long)(pvVar3->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
    pvVar3 = orderedBoundaries.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  orderedBoundaries.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&boundary1,
             orderedBoundaries.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1);
  puVar2 = orderedBoundaries.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar3 = orderedBoundaries.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (puVar2 != (pointer)0x0) {
    pvVar3 = orderedBoundaries.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    orderedBoundaries.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         orderedBoundaries.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(puVar2,(long)(pvVar3->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
    pvVar3 = orderedBoundaries.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  orderedBoundaries.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar3;
  m.colSettings_ = (Column_settings *)operator_new(0x38);
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>
  ::Boundary_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>
              *)&m.matrix_,&orderedBoundaries,m.colSettings_);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x1ba);
  local_7b0._0_4_ = 1;
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  local_7b0 = (undefined **)((ulong)local_7b0._4_4_ << 0x20);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.
                    super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                ,(key_type *)&local_7b0);
  pCVar8 = &pmVar4->column_;
  plVar7 = (node_ptr)pCVar8;
  do {
    plVar7 = (((type *)&plVar7->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar7 == (node_ptr)pCVar8) break;
    if (plVar7 == (node_ptr)0x0) goto LAB_0011dfcb;
  } while (*(mapped_type *)&plVar7[1].next_ != *pmVar5);
  local_7e0 = (undefined **)CONCAT71(local_7e0._1_7_,plVar7 == (node_ptr)pCVar8);
  local_7d8 = 0;
  sStack_7d0.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined **)0x1b6b14;
  local_788 = "";
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2250;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_798 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7d0);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x1bb);
  local_7b0._0_4_ = 3;
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  local_7b0 = (undefined **)((ulong)local_7b0._4_4_ << 0x20);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.
                    super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                ,(key_type *)&local_7b0);
  pCVar8 = &pmVar4->column_;
  plVar7 = (node_ptr)pCVar8;
  do {
    plVar7 = (((type *)&plVar7->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar7 == (node_ptr)pCVar8) break;
    if (plVar7 == (node_ptr)0x0) goto LAB_0011dfcb;
  } while (*(mapped_type *)&plVar7[1].next_ != *pmVar5);
  local_7d8 = 0;
  sStack_7d0.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined **)0x1b6b2a;
  local_788 = "";
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2250;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_88 = "";
  local_798 = &local_790;
  local_7e0._0_1_ = plVar7 != (node_ptr)pCVar8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7d0);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x1bc);
  local_7b0 = (undefined **)((ulong)local_7b0 & 0xffffffff00000000);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  local_7e0._0_1_ = plVar7 == (node_ptr)&pmVar4->column_ || plVar7 == (node_ptr)0x0;
  local_7d8 = 0;
  sStack_7d0.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined **)0x1b6b41;
  local_788 = "";
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2250;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_798 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7d0);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x1bd);
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,1);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  local_7e0._0_1_ = plVar7 == (node_ptr)&pmVar4->column_ || plVar7 == (node_ptr)0x0;
  local_7d8 = 0;
  sStack_7d0.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined **)0x1b6b55;
  local_788 = "";
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2250;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_e8 = "";
  local_798 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7d0);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x1be);
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,2);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  local_7e0._0_1_ = plVar7 == (node_ptr)&pmVar4->column_ || plVar7 == (node_ptr)0x0;
  local_7d8 = 0;
  sStack_7d0.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined **)0x1b6b69;
  local_788 = "";
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2250;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_118 = "";
  local_798 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7d0);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x1bf);
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,3);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  local_7e0._0_1_ = plVar7 != (node_ptr)&pmVar4->column_ && plVar7 != (node_ptr)0x0;
  local_7d8 = 0;
  sStack_7d0.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined **)0x1b6b7d;
  local_788 = "";
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2250;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_148 = "";
  local_798 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7d0);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x1c0);
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,4);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  local_7e0 = (undefined **)
              CONCAT71(local_7e0._1_7_,
                       plVar7 != (node_ptr)&pmVar4->column_ && plVar7 != (node_ptr)0x0);
  local_7d8 = 0;
  sStack_7d0.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined **)0x1b6b92;
  local_788 = "";
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2250;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_178 = "";
  local_798 = &local_790;
  boost::test_tools::tt_detail::report_assertion(&local_7e0,&local_7b0,&local_180,0x1c0,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_7d0);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x1c2);
  local_788 = (char *)((ulong)local_788 & 0xffffffffffffff00);
  local_790 = &PTR__lazy_ostream_001f2110;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = "";
  local_7b8 = (undefined **)&local_7e4;
  local_7e4 = (int)m.matrix_.matrix_._M_h._M_element_count;
  local_770[0] = (int)m.matrix_.matrix_._M_h._M_element_count == 5;
  local_7e8 = 5;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_798 = &local_7b8;
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2058;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_7c8 = &local_7c0;
  local_7d8 = local_7d8 & 0xffffffffffffff00;
  local_7e0 = &PTR__lazy_ostream_001f20d0;
  sStack_7d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7c0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,m.matrix_.nextInsertIndex_);
  iVar6 = (int)((ulong)((long)boundary1.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)boundary1.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2) + -1;
  if (boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    iVar6 = 0;
  }
  if (m.matrix_.
      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
      .rowSwapped_ == true) {
    Gudhi::persistence_matrix::
    Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>
    ::_orderRows(&m.matrix_.
                  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                );
  }
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<unsigned_int&,unsigned_int&>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&m.matrix_.
                 super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
             ,&local_7b0);
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<unsigned_int&,unsigned_int&>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&m.matrix_.
                 super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                 .rowToIndex_,&local_7b0,&local_7b0);
  pIVar1 = &m.matrix_.nextInsertIndex_;
  if ((key_type)local_7b0 != m.matrix_.nextInsertIndex_) {
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_int&,unsigned_int&>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&m.matrix_.super_Base_pairing_option.idToPosition_,&local_7b0,pIVar1);
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_int&,unsigned_int&>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&m.matrix_.super_Base_pairing_option,pIVar1,&local_7b0);
  }
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>
  ::_container_insert<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>
              *)&m.matrix_,&boundary1,m.matrix_.nextInsertIndex_,iVar6);
  m.matrix_.nextInsertIndex_ = m.matrix_.nextInsertIndex_ + 1;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x1c4);
  local_788 = (char *)((ulong)local_788 & 0xffffffffffffff00);
  local_790 = &PTR__lazy_ostream_001f2110;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = "";
  local_7e4 = (int)m.matrix_.matrix_._M_h._M_element_count;
  local_770[0] = (int)m.matrix_.matrix_._M_h._M_element_count == 6;
  local_7e8 = 6;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7b8 = (undefined **)&local_7e4;
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2058;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = &local_7b8;
  local_7d8 = local_7d8 & 0xffffffffffffff00;
  local_7e0 = &PTR__lazy_ostream_001f20d0;
  sStack_7d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7c8 = &local_7c0;
  local_7c0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,m.matrix_.nextInsertIndex_);
  iVar6 = (int)((ulong)((long)boundary2.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)boundary2.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2) + -1;
  if (boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    iVar6 = 0;
  }
  pIVar1 = &m.matrix_.nextInsertIndex_;
  if (m.matrix_.
      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
      .rowSwapped_ == true) {
    Gudhi::persistence_matrix::
    Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>
    ::_orderRows(&m.matrix_.
                  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                );
  }
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<unsigned_int&,unsigned_int&>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&m.matrix_.
                 super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
             ,&local_7b0);
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<unsigned_int&,unsigned_int&>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&m.matrix_.
                 super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                 .rowToIndex_,&local_7b0,&local_7b0);
  if ((key_type)local_7b0 != m.matrix_.nextInsertIndex_) {
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_int&,unsigned_int&>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&m.matrix_.super_Base_pairing_option.idToPosition_,&local_7b0,pIVar1);
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_int&,unsigned_int&>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&m.matrix_.super_Base_pairing_option,pIVar1,&local_7b0);
  }
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>
  ::_container_insert<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>
              *)&m.matrix_,&boundary2,m.matrix_.nextInsertIndex_,iVar6);
  m.matrix_.nextInsertIndex_ = m.matrix_.nextInsertIndex_ + 1;
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d0,0x1c6);
  local_788 = (char *)((ulong)local_788 & 0xffffffffffffff00);
  local_790 = &PTR__lazy_ostream_001f2110;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = "";
  local_7e4 = (int)m.matrix_.matrix_._M_h._M_element_count;
  local_770[0] = (int)m.matrix_.matrix_._M_h._M_element_count == 7;
  local_7e8 = 7;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7b8 = (undefined **)&local_7e4;
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2058;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = &local_7b8;
  local_7d8 = local_7d8 & 0xffffffffffffff00;
  local_7e0 = &PTR__lazy_ostream_001f20d0;
  sStack_7d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7c8 = &local_7c0;
  local_7c0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_790,&local_758,0x1c6,1,2,2,"m.get_number_of_columns()",&local_7b0,"7",
             &local_7e0);
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x1c7);
  local_7b0._0_4_ = 1;
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  local_7b0 = (undefined **)((ulong)local_7b0._4_4_ << 0x20);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.
                    super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                ,(key_type *)&local_7b0);
  pCVar8 = &pmVar4->column_;
  plVar7 = (node_ptr)pCVar8;
  do {
    plVar7 = (((type *)&plVar7->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar7 == (node_ptr)pCVar8) break;
    if (plVar7 == (node_ptr)0x0) goto LAB_0011dfcb;
  } while (*(mapped_type *)&plVar7[1].next_ != *pmVar5);
  local_7e0 = (undefined **)CONCAT71(local_7e0._1_7_,plVar7 == (node_ptr)pCVar8);
  local_7d8 = 0;
  sStack_7d0.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined **)0x1b6b14;
  local_788 = "";
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2250;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_208 = "";
  local_798 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7d0);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x1c8);
  local_7b0._0_4_ = 3;
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  local_7b0 = (undefined **)((ulong)local_7b0._4_4_ << 0x20);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.
                    super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                ,(key_type *)&local_7b0);
  pCVar8 = &pmVar4->column_;
  plVar7 = (node_ptr)pCVar8;
  do {
    plVar7 = (((type *)&plVar7->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar7 == (node_ptr)pCVar8) break;
    if (plVar7 == (node_ptr)0x0) goto LAB_0011dfcb;
  } while (*(mapped_type *)&plVar7[1].next_ != *pmVar5);
  local_7d8 = 0;
  sStack_7d0.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined **)0x1b6b2a;
  local_788 = "";
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2250;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_238 = "";
  local_798 = &local_790;
  local_7e0._0_1_ = plVar7 != (node_ptr)pCVar8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7d0);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x1c9);
  local_7b0 = (undefined **)((ulong)local_7b0 & 0xffffffff00000000);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  local_7e0._0_1_ = plVar7 == (node_ptr)&pmVar4->column_ || plVar7 == (node_ptr)0x0;
  local_7d8 = 0;
  sStack_7d0.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined **)0x1b6b41;
  local_788 = "";
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2250;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_268 = "";
  local_798 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7d0);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x1ca);
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,1);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  local_7e0._0_1_ = plVar7 == (node_ptr)&pmVar4->column_ || plVar7 == (node_ptr)0x0;
  local_7d8 = 0;
  sStack_7d0.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined **)0x1b6b55;
  local_788 = "";
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2250;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_298 = "";
  local_798 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7d0);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0x1cb);
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,2);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  local_7e0._0_1_ = plVar7 == (node_ptr)&pmVar4->column_ || plVar7 == (node_ptr)0x0;
  local_7d8 = 0;
  sStack_7d0.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined **)0x1b6b69;
  local_788 = "";
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2250;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2c8 = "";
  local_798 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7d0);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0x1cc);
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,3);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  local_7e0._0_1_ = plVar7 != (node_ptr)&pmVar4->column_ && plVar7 != (node_ptr)0x0;
  local_7d8 = 0;
  sStack_7d0.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined **)0x1b6b7d;
  local_788 = "";
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2250;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f8 = "";
  local_798 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7d0);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_310,0x1cd);
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,4);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  local_7e0._0_1_ = plVar7 != (node_ptr)&pmVar4->column_ && plVar7 != (node_ptr)0x0;
  local_7d8 = 0;
  sStack_7d0.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined **)0x1b6b92;
  local_788 = "";
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2250;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_328 = "";
  local_798 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7d0);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_340,0x1d1);
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,5);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  local_7e0._0_1_ = plVar7 != (node_ptr)&pmVar4->column_ && plVar7 != (node_ptr)0x0;
  local_7d8 = 0;
  sStack_7d0.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined **)0x1b6ba7;
  local_788 = "";
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2250;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_358 = "";
  local_798 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7d0);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_370,0x1d3);
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,6);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  local_7e0 = (undefined **)
              CONCAT71(local_7e0._1_7_,
                       plVar7 != (node_ptr)&pmVar4->column_ && plVar7 != (node_ptr)0x0);
  local_7d8 = 0;
  sStack_7d0.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined **)0x1b6bbc;
  local_788 = "";
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2250;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_388 = "";
  local_798 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7d0);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3a0,0x1d5);
  local_788 = (char *)((ulong)local_788 & 0xffffffffffffff00);
  local_790 = &PTR__lazy_ostream_001f2110;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = "";
  local_7b0 = (undefined **)((ulong)local_7b0 & 0xffffffff00000000);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  local_7e4 = (pmVar4->super_Column_dimension_option).dim_;
  local_7e8 = 0;
  local_770[0] = local_7e4 == 0;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7b8 = (undefined **)&local_7e4;
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f20d0;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = &local_7b8;
  local_7d8 = local_7d8 & 0xffffffffffffff00;
  local_7e0 = &PTR__lazy_ostream_001f20d0;
  sStack_7d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7c8 = &local_7c0;
  local_7c0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_790,&local_758,0x1d5,1,2,2,"m.get_column_dimension(0)",&local_7b0,"0",
             &local_7e0);
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3c0,0x1d6);
  local_788 = (char *)((ulong)local_788 & 0xffffffffffffff00);
  local_790 = &PTR__lazy_ostream_001f2110;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = "";
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,1);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  local_7e4 = (pmVar4->super_Column_dimension_option).dim_;
  local_7e8 = 0;
  local_770[0] = local_7e4 == 0;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7b8 = (undefined **)&local_7e4;
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f20d0;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = &local_7b8;
  local_7d8 = local_7d8 & 0xffffffffffffff00;
  local_7e0 = &PTR__lazy_ostream_001f20d0;
  sStack_7d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7c8 = &local_7c0;
  local_7c0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_790,&local_758,0x1d6,1,2,2,"m.get_column_dimension(1)",&local_7b0,"0",
             &local_7e0);
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3e0,0x1d7);
  local_788 = (char *)((ulong)local_788 & 0xffffffffffffff00);
  local_790 = &PTR__lazy_ostream_001f2110;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = "";
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,2);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  local_7e4 = (pmVar4->super_Column_dimension_option).dim_;
  local_7e8 = 0;
  local_770[0] = local_7e4 == 0;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7b8 = (undefined **)&local_7e4;
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f20d0;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = &local_7b8;
  local_7d8 = local_7d8 & 0xffffffffffffff00;
  local_7e0 = &PTR__lazy_ostream_001f20d0;
  sStack_7d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7c8 = &local_7c0;
  local_7c0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_790,&local_758,0x1d7,1,2,2,"m.get_column_dimension(2)",&local_7b0,"0",
             &local_7e0);
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_400,0x1d8);
  local_788 = (char *)((ulong)local_788 & 0xffffffffffffff00);
  local_790 = &PTR__lazy_ostream_001f2110;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = "";
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,3);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  local_7e4 = (pmVar4->super_Column_dimension_option).dim_;
  local_7e8 = 1;
  local_770[0] = local_7e4 == 1;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7b8 = (undefined **)&local_7e4;
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f20d0;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = &local_7b8;
  local_7d8 = local_7d8 & 0xffffffffffffff00;
  local_7e0 = &PTR__lazy_ostream_001f20d0;
  sStack_7d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7c8 = &local_7c0;
  local_7c0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_790,&local_758,0x1d8,1,2,2,"m.get_column_dimension(3)",&local_7b0,"1",
             &local_7e0);
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_420,0x1d9);
  local_788 = (char *)((ulong)local_788 & 0xffffffffffffff00);
  local_790 = &PTR__lazy_ostream_001f2110;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = "";
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,4);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  local_7e4 = (pmVar4->super_Column_dimension_option).dim_;
  local_7e8 = 1;
  local_770[0] = local_7e4 == 1;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7b8 = (undefined **)&local_7e4;
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f20d0;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = &local_7b8;
  local_7d8 = local_7d8 & 0xffffffffffffff00;
  local_7e0 = &PTR__lazy_ostream_001f20d0;
  sStack_7d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7c8 = &local_7c0;
  local_7c0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_790,&local_758,0x1d9,1,2,2,"m.get_column_dimension(4)",&local_7b0,"1",
             &local_7e0);
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_440,0x1da);
  local_788 = (char *)((ulong)local_788 & 0xffffffffffffff00);
  local_790 = &PTR__lazy_ostream_001f2110;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = "";
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,5);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  local_7e4 = (pmVar4->super_Column_dimension_option).dim_;
  local_7e8 = 1;
  local_770[0] = local_7e4 == 1;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7b8 = (undefined **)&local_7e4;
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f20d0;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = &local_7b8;
  local_7d8 = local_7d8 & 0xffffffffffffff00;
  local_7e0 = &PTR__lazy_ostream_001f20d0;
  sStack_7d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7c8 = &local_7c0;
  local_7c0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_790,&local_758,0x1da,1,2,2,"m.get_column_dimension(5)",&local_7b0,"1",
             &local_7e0);
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_460,0x1db);
  local_788 = (char *)((ulong)local_788 & 0xffffffffffffff00);
  local_790 = &PTR__lazy_ostream_001f2110;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = "";
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,6);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  local_7e4 = (pmVar4->super_Column_dimension_option).dim_;
  local_7e8 = 2;
  local_770[0] = local_7e4 == 2;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7b8 = (undefined **)&local_7e4;
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f20d0;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = &local_7b8;
  local_7d8 = local_7d8 & 0xffffffffffffff00;
  local_7e0 = &PTR__lazy_ostream_001f20d0;
  sStack_7d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7c8 = &local_7c0;
  local_7c0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_790,&local_758,0x1db,1,2,2,"m.get_column_dimension(6)",&local_7b0,"2",
             &local_7e0);
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_480,0x1dd);
  local_788 = (char *)((ulong)local_788 & 0xffffffffffffff00);
  local_790 = &PTR__lazy_ostream_001f2110;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = "";
  if (m.matrix_.
      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
      .rowSwapped_ == true) {
    Gudhi::persistence_matrix::
    Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>
    ::_orderRows(&m.matrix_.
                  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                );
  }
  local_7b0 = (undefined **)((ulong)local_7b0 & 0xffffffff00000000);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  iVar6 = -1;
  if (plVar7 != (node_ptr)&pmVar4->column_ && plVar7 != (node_ptr)0x0) {
    plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.prev_;
    if (plVar7 == (node_ptr)0x0) goto LAB_0011dfcb;
    iVar6 = *(int *)&plVar7[1].next_;
  }
  local_7e8 = 0xffffffff;
  local_770[0] = iVar6 == -1;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7b8 = (undefined **)&local_7e4;
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2058;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = &local_7b8;
  local_7d8 = local_7d8 & 0xffffffffffffff00;
  local_7e0 = &PTR__lazy_ostream_001f2058;
  sStack_7d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7c8 = &local_7c0;
  local_7e4 = iVar6;
  local_7c0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_790,&local_758,0x1dd,1,2,2,"m.get_pivot(0)",&local_7b0,
             "Matrix::template get_null_value<typename Matrix::ID_index>()",&local_7e0);
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4a0,0x1de);
  local_788 = (char *)((ulong)local_788 & 0xffffffffffffff00);
  local_790 = &PTR__lazy_ostream_001f2110;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = "";
  if (m.matrix_.
      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
      .rowSwapped_ == true) {
    Gudhi::persistence_matrix::
    Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>
    ::_orderRows(&m.matrix_.
                  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                );
  }
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,1);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  iVar6 = -1;
  if (plVar7 != (node_ptr)&pmVar4->column_ && plVar7 != (node_ptr)0x0) {
    plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.prev_;
    if (plVar7 == (node_ptr)0x0) goto LAB_0011dfcb;
    iVar6 = *(int *)&plVar7[1].next_;
  }
  local_7e8 = 0xffffffff;
  local_770[0] = iVar6 == -1;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7b8 = (undefined **)&local_7e4;
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2058;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = &local_7b8;
  local_7d8 = local_7d8 & 0xffffffffffffff00;
  local_7e0 = &PTR__lazy_ostream_001f2058;
  sStack_7d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7c8 = &local_7c0;
  local_7e4 = iVar6;
  local_7c0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_790,&local_758,0x1de,1,2,2,"m.get_pivot(1)",&local_7b0,
             "Matrix::template get_null_value<typename Matrix::ID_index>()",&local_7e0);
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4c0,0x1df);
  local_788 = (char *)((ulong)local_788 & 0xffffffffffffff00);
  local_790 = &PTR__lazy_ostream_001f2110;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = "";
  if (m.matrix_.
      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
      .rowSwapped_ == true) {
    Gudhi::persistence_matrix::
    Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>
    ::_orderRows(&m.matrix_.
                  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                );
  }
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,2);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  iVar6 = -1;
  if (plVar7 != (node_ptr)&pmVar4->column_ && plVar7 != (node_ptr)0x0) {
    plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.prev_;
    if (plVar7 == (node_ptr)0x0) goto LAB_0011dfcb;
    iVar6 = *(int *)&plVar7[1].next_;
  }
  local_7e8 = 0xffffffff;
  local_770[0] = iVar6 == -1;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7b8 = (undefined **)&local_7e4;
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2058;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = &local_7b8;
  local_7d8 = local_7d8 & 0xffffffffffffff00;
  local_7e0 = &PTR__lazy_ostream_001f2058;
  sStack_7d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7c8 = &local_7c0;
  local_7e4 = iVar6;
  local_7c0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_790,&local_758,0x1df,1,2,2,"m.get_pivot(2)",&local_7b0,
             "Matrix::template get_null_value<typename Matrix::ID_index>()",&local_7e0);
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_4e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4d8 = "";
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4e0,0x1e0);
  local_788 = (char *)((ulong)local_788 & 0xffffffffffffff00);
  local_790 = &PTR__lazy_ostream_001f2110;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = "";
  if (m.matrix_.
      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
      .rowSwapped_ == true) {
    Gudhi::persistence_matrix::
    Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>
    ::_orderRows(&m.matrix_.
                  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                );
  }
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,3);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  iVar6 = -1;
  if (plVar7 != (node_ptr)&pmVar4->column_ && plVar7 != (node_ptr)0x0) {
    plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.prev_;
    if (plVar7 == (node_ptr)0x0) goto LAB_0011dfcb;
    iVar6 = *(int *)&plVar7[1].next_;
  }
  local_7e8 = 1;
  local_770[0] = iVar6 == 1;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7b8 = (undefined **)&local_7e4;
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2058;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = &local_7b8;
  local_7d8 = local_7d8 & 0xffffffffffffff00;
  local_7e0 = &PTR__lazy_ostream_001f20d0;
  sStack_7d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7c8 = &local_7c0;
  local_7e4 = iVar6;
  local_7c0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_790,&local_758,0x1e0,1,2,2,"m.get_pivot(3)",&local_7b0,"1",&local_7e0)
  ;
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_500,0x1e1);
  local_788 = (char *)((ulong)local_788 & 0xffffffffffffff00);
  local_790 = &PTR__lazy_ostream_001f2110;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = "";
  if (m.matrix_.
      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
      .rowSwapped_ == true) {
    Gudhi::persistence_matrix::
    Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>
    ::_orderRows(&m.matrix_.
                  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                );
  }
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,4);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  iVar6 = -1;
  if (plVar7 != (node_ptr)&pmVar4->column_ && plVar7 != (node_ptr)0x0) {
    plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.prev_;
    if (plVar7 == (node_ptr)0x0) goto LAB_0011dfcb;
    iVar6 = *(int *)&plVar7[1].next_;
  }
  local_7e8 = 2;
  local_770[0] = iVar6 == 2;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7b8 = (undefined **)&local_7e4;
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2058;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = &local_7b8;
  local_7d8 = local_7d8 & 0xffffffffffffff00;
  local_7e0 = &PTR__lazy_ostream_001f20d0;
  sStack_7d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7c8 = &local_7c0;
  local_7e4 = iVar6;
  local_7c0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_790,&local_758,0x1e1,1,2,2,"m.get_pivot(4)",&local_7b0,"2",&local_7e0)
  ;
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_520,0x1e5);
  local_788 = (char *)((ulong)local_788 & 0xffffffffffffff00);
  local_790 = &PTR__lazy_ostream_001f2110;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = "";
  if (m.matrix_.
      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
      .rowSwapped_ == true) {
    Gudhi::persistence_matrix::
    Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>
    ::_orderRows(&m.matrix_.
                  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                );
  }
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,5);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  iVar6 = -1;
  if (plVar7 != (node_ptr)&pmVar4->column_ && plVar7 != (node_ptr)0x0) {
    plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.prev_;
    if (plVar7 == (node_ptr)0x0) goto LAB_0011dfcb;
    iVar6 = *(int *)&plVar7[1].next_;
  }
  local_7e8 = 2;
  local_770[0] = iVar6 == 2;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7b8 = (undefined **)&local_7e4;
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2058;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = &local_7b8;
  local_7d8 = local_7d8 & 0xffffffffffffff00;
  local_7e0 = &PTR__lazy_ostream_001f20d0;
  sStack_7d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7c8 = &local_7c0;
  local_7e4 = iVar6;
  local_7c0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_790,&local_758,0x1e5,1,2,2,"m.get_pivot(5)",&local_7b0,"2",&local_7e0)
  ;
  boost::detail::shared_count::~shared_count(&sStack_760);
  local_540 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_538 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_540,0x1e7);
  local_788 = (char *)((ulong)local_788 & 0xffffffffffffff00);
  local_790 = &PTR__lazy_ostream_001f2110;
  local_780 = &boost::unit_test::lazy_ostream::inst;
  local_778 = "";
  if (m.matrix_.
      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
      .rowSwapped_ == true) {
    Gudhi::persistence_matrix::
    Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>
    ::_orderRows(&m.matrix_.
                  super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<true,_(Column_types)7,_true,_true,_true>_>_>_>
                );
  }
  local_7b0 = (undefined **)CONCAT44(local_7b0._4_4_,6);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&m.matrix_.matrix_,(key_type *)&local_7b0);
  plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  iVar6 = -1;
  if (plVar7 != (node_ptr)&pmVar4->column_ && plVar7 != (node_ptr)0x0) {
    plVar7 = (pmVar4->column_).super_type.data_.root_plus_size_.m_header.super_node.prev_;
    if (plVar7 == (node_ptr)0x0) {
LAB_0011dfcb:
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<Boundary_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<Boundary_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true>>::Matrix_column_tag, Type = 1]"
                   );
    }
    iVar6 = *(int *)&plVar7[1].next_;
  }
  local_7e8 = 5;
  local_770[0] = iVar6 == 5;
  local_768 = 0;
  sStack_760.pi_ = (sp_counted_base *)0x0;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_750 = "";
  local_7b8 = (undefined **)&local_7e4;
  local_7a8 = 0;
  local_7b0 = &PTR__lazy_ostream_001f2058;
  local_7a0 = &boost::unit_test::lazy_ostream::inst;
  local_798 = &local_7b8;
  local_7d8 = local_7d8 & 0xffffffffffffff00;
  local_7e0 = &PTR__lazy_ostream_001f20d0;
  sStack_7d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7c8 = &local_7c0;
  local_7e4 = iVar6;
  local_7c0 = (undefined1 *)&local_7e8;
  boost::test_tools::tt_detail::report_assertion
            (local_770,&local_790,&local_758,0x1e7,1,2,2,"m.get_pivot(6)",&local_7b0,"5",&local_7e0)
  ;
  boost::detail::shared_count::~shared_count(&sStack_760);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::
  ~Matrix(&m);
  if (boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&orderedBoundaries);
  return;
}

Assistant:

void test_boundary_insertion() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();
  auto boundary2 = orderedBoundaries.back();
  orderedBoundaries.pop_back();
  auto boundary1 = orderedBoundaries.back();
  orderedBoundaries.pop_back();

  Matrix m(orderedBoundaries, 5);
  BOOST_CHECK(m.is_zero_entry(1, 0));
  BOOST_CHECK(!m.is_zero_entry(3, 0));
  BOOST_CHECK(m.is_zero_column(0));
  BOOST_CHECK(m.is_zero_column(1));
  BOOST_CHECK(m.is_zero_column(2));
  BOOST_CHECK(!m.is_zero_column(3));
  BOOST_CHECK(!m.is_zero_column(4));

  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 5);
  m.insert_boundary(boundary1);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 6);
  m.insert_boundary(boundary2);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 7);
  BOOST_CHECK(m.is_zero_entry(1, 0));
  BOOST_CHECK(!m.is_zero_entry(3, 0));
  BOOST_CHECK(m.is_zero_column(0));
  BOOST_CHECK(m.is_zero_column(1));
  BOOST_CHECK(m.is_zero_column(2));
  BOOST_CHECK(!m.is_zero_column(3));
  BOOST_CHECK(!m.is_zero_column(4));
  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK(m.is_zero_column(5));  // was reduced
  } else {
    BOOST_CHECK(!m.is_zero_column(5));  // not reduced
  }
  BOOST_CHECK(!m.is_zero_column(6));

  BOOST_CHECK_EQUAL(m.get_column_dimension(0), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(1), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(3), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(4), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(5), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(6), 2);

  BOOST_CHECK_EQUAL(m.get_pivot(0), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(1), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(2), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(3), 1);
  BOOST_CHECK_EQUAL(m.get_pivot(4), 2);
  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK_EQUAL(m.get_pivot(5), Matrix::template get_null_value<typename Matrix::ID_index>());  // was reduced
  } else {
    BOOST_CHECK_EQUAL(m.get_pivot(5), 2);  // not reduced
  }
  BOOST_CHECK_EQUAL(m.get_pivot(6), 5);

  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(1), 3);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(2), 4);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(5), 6);
  }
}